

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O2

RecyclableObject *
TTD::NSSnapObjects::DoObjectInflation_SnapDate(SnapObject *snpObject,InflateMap *inflator)

{
  ScriptContext *pSVar1;
  double *pdVar2;
  RecyclableObject *pRVar3;
  
  pSVar1 = InflateMap::LookupScriptContext(inflator,snpObject->SnapType->ScriptContextLogId);
  pdVar2 = SnapObjectGetAddtlInfoAs<double*,(TTD::NSSnapObjects::SnapObjectType)16>(snpObject);
  pRVar3 = Js::JavascriptLibrary::CreateDate_TTD
                     ((pSVar1->super_ScriptContextBase).javascriptLibrary,*pdVar2);
  return pRVar3;
}

Assistant:

Js::RecyclableObject* DoObjectInflation_SnapDate(const SnapObject* snpObject, InflateMap* inflator)
        {
            //Dates are not too common and have some mutable state so it seems easiest to always re-create them.
            //We can re-evaluate this choice later if needed.

            Js::ScriptContext* ctx = inflator->LookupScriptContext(snpObject->SnapType->ScriptContextLogId);
            double* dateInfo = SnapObjectGetAddtlInfoAs<double*, SnapObjectType::SnapDateObject>(snpObject);

            return ctx->GetLibrary()->CreateDate_TTD(*dateInfo);
        }